

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gain_calculator_objects.cpp
# Opt level: O3

void __thiscall
ear::throw_if_not_implemented::operator()
          (throw_if_not_implemented *this,PolarObjectDivergence *divergence)

{
  not_implemented *this_00;
  string local_40;
  
  if ((divergence->divergence == 0.0) && (!NAN(divergence->divergence))) {
    return;
  }
  this_00 = (not_implemented *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"divergence","");
  not_implemented::not_implemented(this_00,&local_40);
  __cxa_throw(this_00,&not_implemented::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void operator()(const PolarObjectDivergence& divergence) const {
      if (divergence.divergence != 0.0) throw not_implemented("divergence");
    }